

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInput140c5
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x20);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = 0x80;
  pvVar1[0xf] = '@';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = 0xa0;
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = 0xc0;
  pvVar1[0x17] = '@';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = 0xe0;
  pvVar1[0x1b] = '@';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = 'A';
  return 
  "\nlayout(std140, binding = 0, row_major) buffer Input {\n  mat4x2 data0;\n} g_input;\nlayout(std140, binding = 1, row_major) buffer Output {\n  mat4x2 data0;\n} g_output;\nvoid main() {\n  g_output.data0 = g_input.data0;\n}"
  ;
}

Assistant:

const char* GetInput140c5(std::vector<GLubyte>& in_data)
{
	in_data.resize(8 * 4);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	fp[0]	 = 1.0f;
	fp[1]	 = 2.0f;
	fp[2]	 = 3.0f;
	fp[3]	 = 4.0f;
	fp[4]	 = 5.0f;
	fp[5]	 = 6.0f;
	fp[6]	 = 7.0f;
	fp[7]	 = 8.0f;

	return NL "layout(std140, binding = 0, row_major) buffer Input {" NL "  mat4x2 data0;" NL "} g_input;" NL
			  "layout(std140, binding = 1, row_major) buffer Output {" NL "  mat4x2 data0;" NL "} g_output;" NL
			  "void main() {" NL "  g_output.data0 = g_input.data0;" NL "}";
}